

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-poll.c
# Opt level: O1

void poll_cb(uv_fs_t *req)

{
  uv_handle_t *handle;
  long lVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  int iVar4;
  uint64_t uVar5;
  ulong uVar6;
  
  handle = *(uv_handle_t **)&req[-1].mode;
  iVar4 = uv_is_active(handle);
  if ((iVar4 != 0) && ((handle->flags & 3) == 0)) {
    lVar1 = req->result;
    if (lVar1 == 0) {
      if ((*(int *)&req[-1].bufs != 0) &&
         (((((((*(int *)&req[-1].bufs < 0 ||
               ((int)req[1].statbuf.st_uid != (req->statbuf).st_ctim.tv_nsec)) ||
              ((int)req[1].statbuf.st_mode != (req->statbuf).st_mtim.tv_nsec)) ||
             (((int)req[1].statbuf.st_rdev != (req->statbuf).st_birthtim.tv_nsec ||
              (req[1].statbuf.st_nlink != (req->statbuf).st_ctim.tv_sec)))) ||
            ((req[1].statbuf.st_dev != (req->statbuf).st_mtim.tv_sec ||
             ((req[1].statbuf.st_gid != (req->statbuf).st_birthtim.tv_sec ||
              (req[1].reserved[4] != (void *)(req->statbuf).st_size)))))) ||
           (req[1].loop != (uv_loop_t *)(req->statbuf).st_mode)) ||
          ((((req[1].reserved[0] != (void *)(req->statbuf).st_uid ||
             (req[1].reserved[1] != (void *)(req->statbuf).st_gid)) ||
            (req[1].reserved[3] != (void *)(req->statbuf).st_ino)) ||
           (((req[1].data != (void *)(req->statbuf).st_dev ||
             (req[1].cb != (uv_fs_cb)(req->statbuf).st_flags)) ||
            (req[1].result != (req->statbuf).st_gen)))))))) {
        uVar3._0_4_ = req[-1].mode;
        uVar3._4_4_ = req[-1].nbufs;
        (*(code *)req[-1].btime)(uVar3,0,req + 1);
      }
      memcpy(req + 1,&req->statbuf,0xa0);
      *(undefined4 *)&req[-1].bufs = 1;
    }
    else if (lVar1 != *(int *)&req[-1].bufs) {
      uVar2._0_4_ = req[-1].mode;
      uVar2._4_4_ = req[-1].nbufs;
      (*(code *)req[-1].btime)(uVar2,lVar1,req + 1);
      *(int *)&req[-1].bufs = (int)req->result;
    }
  }
  uv_fs_req_cleanup(req);
  iVar4 = uv_is_active(handle);
  if ((iVar4 != 0) && ((handle->flags & 3) == 0)) {
    uVar6 = (ulong)*(uint *)((long)&req[-1].bufs + 4);
    uVar5 = uv_now(*(uv_loop_t **)&req[-1].uid);
    iVar4 = uv_timer_start((uv_timer_t *)&req[-1].atime,timer_cb,
                           uVar6 - (uVar5 - req[-1].off) % uVar6,0);
    if (iVar4 == 0) {
      return;
    }
    abort();
  }
  uv_close((uv_handle_t *)&req[-1].atime,timer_close_cb);
  return;
}

Assistant:

static void poll_cb(uv_fs_poll_t* handle,
                    int status,
                    const uv_stat_t* prev,
                    const uv_stat_t* curr) {
  uv_stat_t zero_statbuf;

  memset(&zero_statbuf, 0, sizeof(zero_statbuf));

  ASSERT_PTR_EQ(handle, &poll_handle);
  ASSERT_EQ(1, uv_is_active((uv_handle_t*) handle));
  ASSERT_NOT_NULL(prev);
  ASSERT_NOT_NULL(curr);

  switch (poll_cb_called++) {
  case 0:
    ASSERT_EQ(status, UV_ENOENT);
    ASSERT_OK(memcmp(prev, &zero_statbuf, sizeof(zero_statbuf)));
    ASSERT_OK(memcmp(curr, &zero_statbuf, sizeof(zero_statbuf)));
    touch_file(FIXTURE);
    break;

  case 1:
    ASSERT_OK(status);
    ASSERT_OK(memcmp(prev, &zero_statbuf, sizeof(zero_statbuf)));
    ASSERT_NE(0, memcmp(curr, &zero_statbuf, sizeof(zero_statbuf)));
    ASSERT_OK(uv_timer_start(&timer_handle, timer_cb, 20, 0));
    break;

  case 2:
    ASSERT_OK(status);
    ASSERT_NE(0, memcmp(prev, &zero_statbuf, sizeof(zero_statbuf)));
    ASSERT_NE(0, memcmp(curr, &zero_statbuf, sizeof(zero_statbuf)));
    ASSERT_OK(uv_timer_start(&timer_handle, timer_cb, 200, 0));
    break;

  case 3:
    ASSERT_OK(status);
    ASSERT_NE(0, memcmp(prev, &zero_statbuf, sizeof(zero_statbuf)));
    ASSERT_NE(0, memcmp(curr, &zero_statbuf, sizeof(zero_statbuf)));
    remove(FIXTURE);
    break;

  case 4:
    ASSERT_EQ(status, UV_ENOENT);
    ASSERT_NE(0, memcmp(prev, &zero_statbuf, sizeof(zero_statbuf)));
    ASSERT_OK(memcmp(curr, &zero_statbuf, sizeof(zero_statbuf)));
    uv_close((uv_handle_t*)handle, close_cb);
    break;

  default:
    ASSERT(0);
  }
}